

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O0

void __thiscall
MixSegmentTest_NoUserDict_Test::~MixSegmentTest_NoUserDict_Test
          (MixSegmentTest_NoUserDict_Test *this)

{
  void *in_RDI;
  
  ~MixSegmentTest_NoUserDict_Test((MixSegmentTest_NoUserDict_Test *)0x1cd0d8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(MixSegmentTest, NoUserDict) {
  MixSegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8");
  const char* str = "令狐冲是云计算方面的专家";
  vector<string> words;
  segment.Cut(str, words);
  string res;
  ASSERT_EQ("[\"令狐冲\", \"是\", \"云\", \"计算\", \"方面\", \"的\", \"专家\"]", res << words);

}